

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.cpp
# Opt level: O0

void empty(void)

{
  bool bVar1;
  mapped_type *pmVar2;
  iterator ppVar3;
  pair<char,_int> **local_70;
  pair<char,_int> *result_pos;
  pair<char,_int> results [3];
  key_type local_46 [19];
  key_type local_33;
  allocator local_32;
  key_compare local_31;
  undefined1 local_30 [8];
  vector_map<char,_int,_eastl::less<char>,_eastl::allocator> mymap;
  
  eastl::allocator::allocator(&local_32,"EASTL vector");
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::vector_map
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,&local_31,
             &local_32);
  local_33 = 'a';
  pmVar2 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      &local_33);
  *pmVar2 = 10;
  local_46[1] = 0x62;
  pmVar2 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_46 + 1);
  *pmVar2 = 0x14;
  local_46[0] = 'c';
  pmVar2 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_46);
  *pmVar2 = 0x1e;
  result_pos = (pair<char,_int> *)eastl::make_pair<char,int>('a',10);
  results[0] = eastl::make_pair<char,int>('b',0x14);
  results[1] = eastl::make_pair<char,int>('c',0x1e);
  local_70 = &result_pos;
  while( true ) {
    bVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::empty
                      ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::~vector_map
                ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
      return;
    }
    ppVar3 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::begin
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
    if (ppVar3->first != *(char *)local_70) break;
    ppVar3 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::begin
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
    if (ppVar3->second != *(int *)((long)local_70 + 4)) {
      __assert_fail("mymap.begin()->second == result_pos->second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                    ,0x70,"void empty()");
    }
    ppVar3 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::begin
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
    eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::erase
              ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,ppVar3);
    local_70 = local_70 + 1;
  }
  __assert_fail("mymap.begin()->first == result_pos->first",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                ,0x6f,"void empty()");
}

Assistant:

static void empty() {
  eastl::vector_map<char, int> mymap;

  mymap['a']=10;
  mymap['b']=20;
  mymap['c']=30;

  eastl::pair<char, int> const results[] = {
    eastl::make_pair('a', 10),
    eastl::make_pair('b', 20),
    eastl::make_pair('c', 30),
  };

  eastl::pair<char, int> const* result_pos = results;

  while (!mymap.empty())
  {
    assert(mymap.begin()->first == result_pos->first);
    assert(mymap.begin()->second == result_pos->second);
    mymap.erase(mymap.begin());
    ++result_pos;
  }
}